

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O3

NodeRef __thiscall
embree::avx::BVHNBuilderVirtual<4>::
BVHNBuilderT<embree::avx::CreateLeafGrid<4,_embree::SubGridQBVHN<4>_>_>::createLeaf
          (BVHNBuilderT<embree::avx::CreateLeafGrid<4,_embree::SubGridQBVHN<4>_>_> *this,
          PrimRef *prims,range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  char *pcVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  unsigned_long uVar7;
  FastAllocator *this_00;
  ThreadLocal *pTVar8;
  ThreadLocal2 *this_01;
  iterator __position;
  SubGridBuildData *pSVar9;
  undefined8 *puVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 *puVar20;
  uint uVar21;
  ulong uVar22;
  char *pcVar23;
  size_t sVar24;
  ulong uVar25;
  char *pcVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  float *pfVar30;
  ulong uVar31;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  uint y [4];
  uint x [4];
  uint geomIDs [4];
  AABBNode node;
  uint primID [4];
  BBox3fa bounds [4];
  undefined8 *local_210 [2];
  ThreadLocal2 *local_200 [2];
  float local_1f0 [6];
  BVHNBuilderT<embree::avx::CreateLeafGrid<4,_embree::SubGridQBVHN<4>_>_> *local_1d8;
  unsigned_long local_1d0;
  unsigned_long local_1c8;
  undefined8 *local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined4 local_1a0 [36];
  uint auStack_110 [4];
  undefined8 local_100;
  char local_f8 [8];
  undefined4 auStack_f0 [48];
  
  local_1d8 = this;
  uVar7 = set->_begin;
  local_1d0 = set->_end;
  uVar31 = set->_end - uVar7;
  local_1c8 = uVar7;
  local_1f0[0] = prims[uVar7].lower.field_0.m128[3];
  uVar21 = 1;
  if (1 < uVar31) {
    uVar25 = 1;
    do {
      fVar5 = prims[uVar7 + uVar25].lower.field_0.m128[3];
      uVar22 = (ulong)uVar21;
      if (uVar21 != 0) {
        uVar27 = 0;
        do {
          if (fVar5 == local_1f0[uVar27]) goto LAB_012b8314;
          uVar27 = uVar27 + 1;
        } while (uVar22 != uVar27);
      }
      uVar21 = uVar21 + 1;
      local_1f0[uVar22] = fVar5;
LAB_012b8314:
      uVar25 = uVar25 + 1;
    } while (uVar25 != uVar31);
  }
  uVar25 = (ulong)uVar21;
  this_00 = alloc->alloc;
  pTVar8 = alloc->talloc1;
  local_210[0] = (undefined8 *)(uVar25 * 0x58);
  this_01 = pTVar8->parent;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_f8[0] = '\x01';
    local_100 = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_1c0 = &FastAllocator::s_thread_local_allocators_lock;
    uStack_1b8 = CONCAT71(uStack_1b8._1_7_,1);
    local_200[0] = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,local_200);
    }
    else {
      *__position._M_current = local_200[0];
      pppTVar2 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (local_f8[0] == '\x01') {
      MutexSys::unlock(&local_100->mutex);
    }
  }
  puVar20 = local_210[0];
  pTVar8->bytesUsed = pTVar8->bytesUsed + (long)local_210[0];
  sVar24 = pTVar8->cur;
  uVar27 = (ulong)(-(int)sVar24 & 0xf);
  uVar22 = (long)local_210[0] + uVar27 + sVar24;
  pTVar8->cur = uVar22;
  if (pTVar8->end < uVar22) {
    pTVar8->cur = sVar24;
    puVar10 = (undefined8 *)pTVar8->allocBlockSize;
    if ((undefined8 *)((long)local_210[0] * 4) < puVar10 ||
        (long)local_210[0] * 4 - (long)puVar10 == 0) {
      local_1c0 = puVar10;
      pcVar23 = (char *)FastAllocator::malloc(this_00,(size_t)&local_1c0);
      pTVar8->ptr = pcVar23;
      sVar24 = (pTVar8->end - pTVar8->cur) + pTVar8->bytesWasted;
      pTVar8->bytesWasted = sVar24;
      pTVar8->end = (size_t)local_1c0;
      pTVar8->cur = (size_t)puVar20;
      if (local_1c0 < puVar20) {
        pTVar8->cur = 0;
        local_1c0 = (undefined8 *)pTVar8->allocBlockSize;
        pcVar23 = (char *)FastAllocator::malloc(this_00,(size_t)&local_1c0);
        pTVar8->ptr = pcVar23;
        sVar24 = (pTVar8->end - pTVar8->cur) + pTVar8->bytesWasted;
        pTVar8->bytesWasted = sVar24;
        pTVar8->end = (size_t)local_1c0;
        pTVar8->cur = (size_t)puVar20;
        if (local_1c0 < puVar20) {
          pTVar8->cur = 0;
          pcVar23 = (char *)0x0;
          goto LAB_012b84e4;
        }
      }
      pTVar8->bytesWasted = sVar24;
    }
    else {
      pcVar23 = (char *)FastAllocator::malloc(this_00,(size_t)local_210);
    }
  }
  else {
    pTVar8->bytesWasted = pTVar8->bytesWasted + uVar27;
    pcVar23 = pTVar8->ptr + (uVar22 - (long)local_210[0]);
  }
LAB_012b84e4:
  if (uVar25 != 0) {
    uVar22 = 0;
    auVar46 = ZEXT816(0) << 0x40;
    auVar45._8_4_ = 0x7f800000;
    auVar45._0_8_ = 0x7f8000007f800000;
    auVar45._12_4_ = 0x7f800000;
    pcVar26 = pcVar23;
    do {
      fVar5 = local_1f0[uVar22];
      uVar21 = 0;
      if (local_1d0 != local_1c8) {
        pSVar9 = (local_1d8->createLeafFunc).sgrids;
        uVar21 = 0;
        uVar27 = uVar31;
        pfVar30 = prims[uVar7].upper.field_0.m128 + 3;
        do {
          if (pfVar30[-4] == fVar5) {
            fVar6 = *pfVar30;
            uVar32 = (ulong)uVar21;
            local_1f0[uVar32 - 4] = (float)(uint)pSVar9[(uint)fVar6].sx;
            *(uint *)((long)local_210 + uVar32 * 4) = (uint)pSVar9[(uint)fVar6].sy;
            auStack_110[uVar32] = pSVar9[(uint)fVar6].primID;
            *(undefined1 (*) [32])(local_f8 + uVar32 * 0x20 + -8) =
                 *(undefined1 (*) [32])(pfVar30 + -7);
            uVar21 = uVar21 + 1;
          }
          pfVar30 = pfVar30 + 8;
          uVar27 = uVar27 - 1;
        } while (uVar27 != 0);
      }
      lVar28 = uVar22 * 0x58;
      pcVar3 = pcVar23 + lVar28;
      pcVar3[0] = '\0';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3[4] = -1;
      pcVar3[5] = -1;
      pcVar3[6] = -1;
      pcVar3[7] = -1;
      pcVar3[8] = '\0';
      pcVar3[9] = '\0';
      pcVar3[10] = '\0';
      pcVar3[0xb] = '\0';
      pcVar3[0xc] = -1;
      pcVar3[0xd] = -1;
      pcVar3[0xe] = -1;
      pcVar3[0xf] = -1;
      pcVar3[0x10] = '\0';
      pcVar3[0x11] = '\0';
      pcVar3[0x12] = '\0';
      pcVar3[0x13] = '\0';
      pcVar3[0x14] = -1;
      pcVar3[0x15] = -1;
      pcVar3[0x16] = -1;
      pcVar3[0x17] = -1;
      pcVar3[0x18] = '\0';
      pcVar3[0x19] = '\0';
      pcVar3[0x1a] = '\0';
      pcVar3[0x1b] = '\0';
      pcVar3[0x1c] = -1;
      pcVar3[0x1d] = -1;
      pcVar3[0x1e] = -1;
      pcVar3[0x1f] = -1;
      pcVar3 = pcVar23 + lVar28 + 0x20;
      pcVar3[0] = -1;
      pcVar3[1] = -1;
      pcVar3[2] = -1;
      pcVar3[3] = -1;
      pcVar3 = pcVar23 + lVar28 + 0x30;
      pcVar3[0] = -1;
      pcVar3[1] = -1;
      pcVar3[2] = -1;
      pcVar3[3] = -1;
      pcVar3 = pcVar23 + lVar28 + 0x28;
      pcVar3[0] = -1;
      pcVar3[1] = -1;
      pcVar3[2] = -1;
      pcVar3[3] = -1;
      pcVar3 = pcVar23 + lVar28 + 0x24;
      pcVar3[0] = '\0';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3 = pcVar23 + lVar28 + 0x34;
      pcVar3[0] = '\0';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3 = pcVar23 + lVar28 + 0x2c;
      pcVar3[0] = '\0';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      *(float *)(pcVar23 + lVar28 + 0x50) = fVar5;
      local_1a0[0x10] = 0x7f800000;
      local_1a0[0x11] = 0x7f800000;
      local_1a0[0x12] = 0x7f800000;
      local_1a0[0x13] = 0x7f800000;
      local_1a0[8] = 0x7f800000;
      local_1a0[9] = 0x7f800000;
      local_1a0[10] = 0x7f800000;
      local_1a0[0xb] = 0x7f800000;
      local_1a0[0] = 0x7f800000;
      local_1a0[1] = 0x7f800000;
      local_1a0[2] = 0x7f800000;
      local_1a0[3] = 0x7f800000;
      local_1a0[0x14] = 0xff800000;
      local_1a0[0x15] = 0xff800000;
      local_1a0[0x16] = 0xff800000;
      local_1a0[0x17] = 0xff800000;
      local_1a0[0xc] = 0xff800000;
      local_1a0[0xd] = 0xff800000;
      local_1a0[0xe] = 0xff800000;
      local_1a0[0xf] = 0xff800000;
      local_1a0[4] = 0xff800000;
      local_1a0[5] = 0xff800000;
      local_1a0[6] = 0xff800000;
      local_1a0[7] = 0xff800000;
      local_1c0 = (undefined8 *)0x8;
      uStack_1b8 = 8;
      uStack_1b0 = 8;
      uStack_1a8 = 8;
      if (uVar21 != 0) {
        lVar29 = 0;
        do {
          *(ulong *)(pcVar26 + lVar29 * 2) =
               CONCAT44(*(undefined4 *)((long)auStack_110 + lVar29),
                        *(int *)((long)local_210 + lVar29) << 0x10 |
                        (uint)*(ushort *)((long)local_200 + lVar29));
          uVar4 = *(undefined4 *)(local_f8 + lVar29 * 8 + -4);
          *(undefined4 *)((long)local_1a0 + lVar29) = *(undefined4 *)(local_f8 + lVar29 * 8 + -8);
          *(undefined4 *)((long)local_1a0 + lVar29 + 0x20) = uVar4;
          *(undefined4 *)((long)local_1a0 + lVar29 + 0x40) = *(undefined4 *)(local_f8 + lVar29 * 8);
          *(undefined4 *)((long)local_1a0 + lVar29 + 0x10) = auStack_f0[lVar29 * 2];
          *(undefined4 *)((long)local_1a0 + lVar29 + 0x30) = auStack_f0[lVar29 * 2 + 1];
          *(undefined4 *)((long)local_1a0 + lVar29 + 0x50) = auStack_f0[lVar29 * 2 + 2];
          lVar29 = lVar29 + 4;
        } while ((ulong)uVar21 << 2 != lVar29);
      }
      auVar15._4_4_ = local_1a0[1];
      auVar15._0_4_ = local_1a0[0];
      auVar15._8_4_ = local_1a0[2];
      auVar15._12_4_ = local_1a0[3];
      auVar16._4_4_ = local_1a0[5];
      auVar16._0_4_ = local_1a0[4];
      auVar16._8_4_ = local_1a0[6];
      auVar16._12_4_ = local_1a0[7];
      auVar33 = vshufps_avx(auVar15,auVar15,0xb1);
      auVar33 = vminps_avx(auVar33,auVar15);
      auVar12 = vshufpd_avx(auVar33,auVar33,1);
      auVar11 = vminps_avx(auVar12,auVar33);
      auVar33 = vshufps_avx(auVar16,auVar16,0xb1);
      auVar33 = vmaxps_avx(auVar33,auVar16);
      auVar12 = vshufpd_avx(auVar33,auVar33,1);
      auVar33 = vmaxss_avx(auVar12,auVar33);
      fVar5 = (auVar33._0_4_ - auVar11._0_4_) * 1.0000002;
      auVar33 = vcmpss_avx(ZEXT416((uint)(fVar5 / 255.0)),auVar46,0);
      auVar12 = vblendvps_avx(ZEXT416((uint)(fVar5 / 255.0)),SUB6416(ZEXT464(0x1000000),0),auVar33);
      auVar33 = vcmpss_avx(auVar46,ZEXT416((uint)fVar5),1);
      auVar33 = vandps_avx(auVar33,ZEXT416((uint)(255.0 / fVar5)));
      auVar42 = vshufps_avx(auVar11,auVar11,0);
      auVar34 = vsubps_avx(auVar15,auVar42);
      auVar13 = vshufps_avx(auVar33,auVar33,0);
      auVar33._0_4_ = auVar13._0_4_ * auVar34._0_4_;
      auVar33._4_4_ = auVar13._4_4_ * auVar34._4_4_;
      auVar33._8_4_ = auVar13._8_4_ * auVar34._8_4_;
      auVar33._12_4_ = auVar13._12_4_ * auVar34._12_4_;
      auVar33 = vroundps_avx(auVar33,1);
      auVar33 = vcvtps2dq_avx(auVar33);
      auVar35 = vpmaxsd_avx(auVar33,(undefined1  [16])0x0);
      auVar33 = vsubps_avx(auVar16,auVar42);
      auVar40._0_4_ = auVar13._0_4_ * auVar33._0_4_;
      auVar40._4_4_ = auVar13._4_4_ * auVar33._4_4_;
      auVar40._8_4_ = auVar13._8_4_ * auVar33._8_4_;
      auVar40._12_4_ = auVar13._12_4_ * auVar33._12_4_;
      auVar33 = vroundps_avx(auVar40,2);
      auVar33 = vcvtps2dq_avx(auVar33);
      auVar36._8_4_ = 0xff;
      auVar36._0_8_ = 0xff000000ff;
      auVar36._12_4_ = 0xff;
      auVar40 = vpminsd_avx(auVar33,auVar36);
      auVar33 = vcvtdq2ps_avx(auVar35);
      auVar14 = vshufps_avx(auVar12,auVar12,0);
      auVar34 = vcvtdq2ps_avx(auVar40);
      auVar13 = vcmpps_avx(auVar15,auVar45,4);
      auVar47._0_4_ = auVar42._0_4_ + auVar33._0_4_ * auVar14._0_4_;
      auVar47._4_4_ = auVar42._4_4_ + auVar33._4_4_ * auVar14._4_4_;
      auVar47._8_4_ = auVar42._8_4_ + auVar33._8_4_ * auVar14._8_4_;
      auVar47._12_4_ = auVar42._12_4_ + auVar33._12_4_ * auVar14._12_4_;
      auVar37._0_4_ = auVar42._0_4_ + auVar14._0_4_ * auVar34._0_4_;
      auVar37._4_4_ = auVar42._4_4_ + auVar14._4_4_ * auVar34._4_4_;
      auVar37._8_4_ = auVar42._8_4_ + auVar14._8_4_ * auVar34._8_4_;
      auVar37._12_4_ = auVar42._12_4_ + auVar14._12_4_ * auVar34._12_4_;
      auVar33 = vcmpps_avx(auVar47,auVar15,6);
      auVar33 = vpaddd_avx(auVar33,auVar35);
      auVar34 = vpmaxsd_avx(auVar33,(undefined1  [16])0x0);
      auVar33 = vcmpps_avx(auVar37,auVar16,1);
      auVar33 = vpsubd_avx(auVar40,auVar33);
      auVar35 = vpminsd_avx(auVar33,auVar36);
      auVar33 = vblendvps_avx(auVar36,auVar34,auVar13);
      auVar34 = vpackusdw_avx(auVar33,auVar33);
      auVar33 = vandps_avx(auVar13,auVar35);
      auVar33 = vpackusdw_avx(auVar33,auVar33);
      auVar33 = vpackuswb_avx(auVar34,auVar33);
      auVar33 = vpshufd_avx(auVar33,0xd8);
      *(long *)(pcVar23 + lVar28 + 0x20) = auVar33._0_8_;
      *(float *)(pcVar23 + lVar28 + 0x38) = auVar11._0_4_;
      *(int *)(pcVar23 + lVar28 + 0x44) = auVar12._0_4_;
      auVar17._4_4_ = local_1a0[9];
      auVar17._0_4_ = local_1a0[8];
      auVar17._8_4_ = local_1a0[10];
      auVar17._12_4_ = local_1a0[0xb];
      auVar18._4_4_ = local_1a0[0xd];
      auVar18._0_4_ = local_1a0[0xc];
      auVar18._8_4_ = local_1a0[0xe];
      auVar18._12_4_ = local_1a0[0xf];
      auVar33 = vshufps_avx(auVar17,auVar17,0xb1);
      auVar33 = vminps_avx(auVar33,auVar17);
      auVar12 = vshufpd_avx(auVar33,auVar33,1);
      auVar11 = vminps_avx(auVar12,auVar33);
      auVar33 = vshufps_avx(auVar18,auVar18,0xb1);
      auVar33 = vmaxps_avx(auVar33,auVar18);
      auVar12 = vshufpd_avx(auVar33,auVar33,1);
      auVar33 = vmaxss_avx(auVar12,auVar33);
      fVar5 = (auVar33._0_4_ - auVar11._0_4_) * 1.0000002;
      auVar33 = vcmpss_avx(auVar46,ZEXT416((uint)(fVar5 / 255.0)),0);
      auVar12 = vblendvps_avx(ZEXT416((uint)(fVar5 / 255.0)),SUB6416(ZEXT464(0x1000000),0),auVar33);
      auVar33 = vcmpss_avx(auVar46,ZEXT416((uint)fVar5),1);
      auVar33 = vandps_avx(auVar33,ZEXT416((uint)(255.0 / fVar5)));
      auVar42 = vshufps_avx(auVar11,auVar11,0);
      auVar34 = vsubps_avx(auVar17,auVar42);
      auVar13 = vshufps_avx(auVar33,auVar33,0);
      auVar41._0_4_ = auVar34._0_4_ * auVar13._0_4_;
      auVar41._4_4_ = auVar34._4_4_ * auVar13._4_4_;
      auVar41._8_4_ = auVar34._8_4_ * auVar13._8_4_;
      auVar41._12_4_ = auVar34._12_4_ * auVar13._12_4_;
      auVar33 = vroundps_avx(auVar41,1);
      auVar33 = vcvtps2dq_avx(auVar33);
      auVar35 = vpmaxsd_avx(auVar33,(undefined1  [16])0x0);
      auVar33 = vsubps_avx(auVar18,auVar42);
      auVar34._0_4_ = auVar33._0_4_ * auVar13._0_4_;
      auVar34._4_4_ = auVar33._4_4_ * auVar13._4_4_;
      auVar34._8_4_ = auVar33._8_4_ * auVar13._8_4_;
      auVar34._12_4_ = auVar33._12_4_ * auVar13._12_4_;
      auVar33 = vroundps_avx(auVar34,2);
      auVar33 = vcvtps2dq_avx(auVar33);
      auVar40 = vpminsd_avx(auVar33,auVar36);
      auVar33 = vcvtdq2ps_avx(auVar35);
      auVar14 = vshufps_avx(auVar12,auVar12,0);
      auVar34 = vcvtdq2ps_avx(auVar40);
      auVar13 = vcmpps_avx(auVar17,auVar45,4);
      auVar43._0_4_ = auVar42._0_4_ + auVar14._0_4_ * auVar33._0_4_;
      auVar43._4_4_ = auVar42._4_4_ + auVar14._4_4_ * auVar33._4_4_;
      auVar43._8_4_ = auVar42._8_4_ + auVar14._8_4_ * auVar33._8_4_;
      auVar43._12_4_ = auVar42._12_4_ + auVar14._12_4_ * auVar33._12_4_;
      auVar38._0_4_ = auVar14._0_4_ * auVar34._0_4_ + auVar42._0_4_;
      auVar38._4_4_ = auVar14._4_4_ * auVar34._4_4_ + auVar42._4_4_;
      auVar38._8_4_ = auVar14._8_4_ * auVar34._8_4_ + auVar42._8_4_;
      auVar38._12_4_ = auVar14._12_4_ * auVar34._12_4_ + auVar42._12_4_;
      auVar33 = vcmpps_avx(auVar43,auVar17,6);
      auVar33 = vpaddd_avx(auVar35,auVar33);
      auVar34 = vpmaxsd_avx(auVar33,(undefined1  [16])0x0);
      auVar33 = vcmpps_avx(auVar38,auVar18,1);
      auVar33 = vpsubd_avx(auVar40,auVar33);
      auVar35 = vpminsd_avx(auVar33,auVar36);
      auVar33 = vblendvps_avx(auVar36,auVar34,auVar13);
      auVar34 = vpackusdw_avx(auVar33,auVar33);
      auVar33 = vandps_avx(auVar13,auVar35);
      auVar33 = vpackusdw_avx(auVar33,auVar33);
      auVar33 = vpackuswb_avx(auVar34,auVar33);
      auVar33 = vpshufd_avx(auVar33,0xd8);
      *(long *)(pcVar23 + lVar28 + 0x28) = auVar33._0_8_;
      *(float *)(pcVar23 + lVar28 + 0x3c) = auVar11._0_4_;
      *(int *)(pcVar23 + lVar28 + 0x48) = auVar12._0_4_;
      auVar14._4_4_ = local_1a0[0x11];
      auVar14._0_4_ = local_1a0[0x10];
      auVar14._8_4_ = local_1a0[0x12];
      auVar14._12_4_ = local_1a0[0x13];
      auVar19._4_4_ = local_1a0[0x15];
      auVar19._0_4_ = local_1a0[0x14];
      auVar19._8_4_ = local_1a0[0x16];
      auVar19._12_4_ = local_1a0[0x17];
      auVar33 = vshufps_avx(auVar14,auVar14,0xb1);
      auVar33 = vminps_avx(auVar33,auVar14);
      auVar12 = vshufpd_avx(auVar33,auVar33,1);
      auVar34 = vminps_avx(auVar12,auVar33);
      auVar33 = vshufps_avx(auVar19,auVar19,0xb1);
      auVar33 = vmaxps_avx(auVar33,auVar19);
      auVar12 = vshufpd_avx(auVar33,auVar33,1);
      auVar33 = vmaxss_avx(auVar12,auVar33);
      fVar5 = (auVar33._0_4_ - auVar34._0_4_) * 1.0000002;
      auVar33 = vcmpss_avx(auVar46,ZEXT416((uint)(fVar5 / 255.0)),0);
      auVar12 = vblendvps_avx(ZEXT416((uint)(fVar5 / 255.0)),SUB6416(ZEXT464(0x1000000),0),auVar33);
      auVar33 = vcmpss_avx(auVar46,ZEXT416((uint)fVar5),1);
      auVar33 = vandps_avx(auVar33,ZEXT416((uint)(255.0 / fVar5)));
      auVar40 = vshufps_avx(auVar34,auVar34,0);
      auVar11 = vsubps_avx(auVar14,auVar40);
      auVar13 = vshufps_avx(auVar33,auVar33,0);
      auVar42._0_4_ = auVar11._0_4_ * auVar13._0_4_;
      auVar42._4_4_ = auVar11._4_4_ * auVar13._4_4_;
      auVar42._8_4_ = auVar11._8_4_ * auVar13._8_4_;
      auVar42._12_4_ = auVar11._12_4_ * auVar13._12_4_;
      auVar33 = vroundps_avx(auVar42,1);
      auVar33 = vcvtps2dq_avx(auVar33);
      auVar11 = vpmaxsd_avx(auVar33,(undefined1  [16])0x0);
      auVar33 = vsubps_avx(auVar19,auVar40);
      auVar35._0_4_ = auVar33._0_4_ * auVar13._0_4_;
      auVar35._4_4_ = auVar33._4_4_ * auVar13._4_4_;
      auVar35._8_4_ = auVar33._8_4_ * auVar13._8_4_;
      auVar35._12_4_ = auVar33._12_4_ * auVar13._12_4_;
      auVar33 = vroundps_avx(auVar35,2);
      auVar33 = vcvtps2dq_avx(auVar33);
      auVar35 = vpminsd_avx(auVar33,auVar36);
      auVar33 = vcvtdq2ps_avx(auVar11);
      auVar42 = vshufps_avx(auVar12,auVar12,0);
      auVar13 = vcvtdq2ps_avx(auVar35);
      auVar44._0_4_ = auVar40._0_4_ + auVar42._0_4_ * auVar33._0_4_;
      auVar44._4_4_ = auVar40._4_4_ + auVar42._4_4_ * auVar33._4_4_;
      auVar44._8_4_ = auVar40._8_4_ + auVar42._8_4_ * auVar33._8_4_;
      auVar44._12_4_ = auVar40._12_4_ + auVar42._12_4_ * auVar33._12_4_;
      auVar39._0_4_ = auVar42._0_4_ * auVar13._0_4_ + auVar40._0_4_;
      auVar39._4_4_ = auVar42._4_4_ * auVar13._4_4_ + auVar40._4_4_;
      auVar39._8_4_ = auVar42._8_4_ * auVar13._8_4_ + auVar40._8_4_;
      auVar39._12_4_ = auVar42._12_4_ * auVar13._12_4_ + auVar40._12_4_;
      auVar33 = vcmpps_avx(auVar44,auVar14,6);
      auVar13 = vpaddd_avx(auVar11,auVar33);
      auVar33 = vcmpps_avx(auVar39,auVar19,1);
      auVar11 = vpsubd_avx(auVar35,auVar33);
      auVar33 = vcmpps_avx(auVar14,auVar45,4);
      auVar13 = vpmaxsd_avx(auVar13,(undefined1  [16])0x0);
      auVar13 = vblendvps_avx(auVar36,auVar13,auVar33);
      auVar11 = vpminsd_avx(auVar11,auVar36);
      auVar33 = vandps_avx(auVar33,auVar11);
      auVar13 = vpackusdw_avx(auVar13,auVar13);
      auVar33 = vpackusdw_avx(auVar33,auVar33);
      auVar33 = vpackuswb_avx(auVar13,auVar33);
      auVar33 = vpshufd_avx(auVar33,0xd8);
      *(long *)(pcVar23 + lVar28 + 0x30) = auVar33._0_8_;
      *(float *)(pcVar23 + lVar28 + 0x40) = auVar34._0_4_;
      *(int *)(pcVar23 + lVar28 + 0x4c) = auVar12._0_4_;
      uVar22 = uVar22 + 1;
      pcVar26 = pcVar26 + 0x58;
    } while (uVar22 != uVar25);
  }
  uVar31 = 7;
  if (uVar25 < 7) {
    uVar31 = uVar25;
  }
  return (NodeRef)(uVar31 | (ulong)pcVar23 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }